

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-chat.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pcVar1;
  undefined1 *puVar2;
  ostream *poVar3;
  runtime_error *this;
  long lVar4;
  common_chat_msg *expected;
  ulong uVar5;
  ulong uVar6;
  initializer_list<common_chat_msg> __l;
  initializer_list<common_chat_msg> __l_00;
  initializer_list<common_chat_msg> __l_01;
  initializer_list<common_chat_msg> __l_02;
  value_type name;
  string path;
  string format;
  common_chat_templates_ptr tmpls;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  vector<common_chat_msg,_std::allocator<common_chat_msg>_> msgs2;
  common_chat_templates_inputs inputs;
  common_chat_msg msg;
  undefined1 local_988 [40];
  undefined1 local_960 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_940;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_930;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_920;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_910;
  _Any_data local_8f8;
  pointer local_8e8;
  _Alloc_hider _Stack_8e0;
  char *local_8d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8d0;
  _Alloc_hider local_8c0;
  vector<common_grammar_trigger,_std::allocator<common_grammar_trigger>_> *local_8b8 [2];
  vector<common_grammar_trigger,_std::allocator<common_grammar_trigger>_> local_8a8;
  vector<common_grammar_trigger,_std::allocator<common_grammar_trigger>_> local_890;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_878 [3];
  char local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [80];
  undefined1 local_7b8 [29];
  bool local_79b;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_788;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_778;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_768;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_758;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_748;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_718;
  undefined8 local_710;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_708;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6f8;
  undefined8 local_6f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6d8;
  undefined8 local_6d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6c8;
  common_chat_msg local_6b8;
  common_chat_msg local_5e8;
  common_chat_msg local_518;
  common_chat_msg local_448;
  common_chat_msg local_378;
  common_chat_msg local_2a8;
  common_chat_msg local_1d8;
  common_chat_msg local_108;
  
  if (argc < 2) {
    common_chat_msg::common_chat_msg((common_chat_msg *)&local_788,&message_user);
    common_chat_msg::common_chat_msg(&local_6b8,&message_user_parts);
    common_chat_msg::common_chat_msg(&local_5e8,&message_assist_call);
    common_chat_msg::common_chat_msg(&local_518,&message_assist_call_thoughts);
    common_chat_msg::common_chat_msg(&local_448,&message_assist_call_thoughts_unparsed);
    common_chat_msg::common_chat_msg(&local_378,&message_assist_call_id);
    common_chat_msg::common_chat_msg(&local_2a8,&message_assist_call_idx);
    common_chat_msg::common_chat_msg(&local_1d8,&message_assist_call_python);
    common_chat_msg::common_chat_msg(&local_108,&message_assist_call_code_interpreter);
    __l._M_len = 9;
    __l._M_array = (iterator)&local_788;
    std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::vector
              ((vector<common_chat_msg,_std::allocator<common_chat_msg>_> *)local_960,__l,
               (allocator_type *)local_8f8._M_pod_data);
    lVar4 = 0x680;
    do {
      common_chat_msg::~common_chat_msg((common_chat_msg *)((long)&local_788 + lVar4));
      lVar4 = lVar4 + -0xd0;
    } while (lVar4 != -0xd0);
    if (local_960._0_8_ != local_960._8_8_) {
      expected = (common_chat_msg *)local_960._0_8_;
      do {
        common_chat_msg::common_chat_msg((common_chat_msg *)&local_788,expected);
        __l_02._M_len = 1;
        __l_02._M_array = (iterator)&local_788;
        std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::vector
                  ((vector<common_chat_msg,_std::allocator<common_chat_msg>_> *)&local_8f8,__l_02,
                   (allocator_type *)local_988);
        common_chat_msgs_to_json_oaicompat<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                  ((vector<common_chat_msg,_std::allocator<common_chat_msg>_> *)local_818,
                   SUB81(&local_8f8,0));
        std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::~vector
                  ((vector<common_chat_msg,_std::allocator<common_chat_msg>_> *)&local_8f8);
        common_chat_msg::~common_chat_msg((common_chat_msg *)&local_788);
        common_chat_msgs_parse_oaicompat<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                  ((vector<common_chat_msg,_std::allocator<common_chat_msg>_> *)&local_8f8,
                   (json *)local_818);
        local_788._M_allocated_capacity = 1;
        local_988._0_8_ = ((long)(local_8f8._8_8_ - local_8f8._0_8_) >> 4) * 0x4ec4ec4ec4ec4ec5;
        assert_equals<unsigned_long>(&local_788._M_allocated_capacity,(unsigned_long *)local_988);
        common_chat_msg::common_chat_msg
                  ((common_chat_msg *)&local_788,(common_chat_msg *)local_8f8._M_unused._0_8_);
        assert_msg_equals(expected,(common_chat_msg *)&local_788);
        common_chat_msg::~common_chat_msg((common_chat_msg *)&local_788);
        std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::~vector
                  ((vector<common_chat_msg,_std::allocator<common_chat_msg>_> *)&local_8f8);
        nlohmann::json_abi_v3_11_3::
        basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)local_818);
        expected = expected + 1;
      } while (expected != (common_chat_msg *)local_960._8_8_);
    }
    local_8f8._M_unused._M_object = &local_8e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_8f8,
               "[\n  {\n    \"role\": \"user\",\n    \"content\": [\n      {\n        \"type\": \"text\",\n        \"text\": \"Hey\"\n      },\n      {\n        \"type\": \"text\",\n        \"text\": \"there\"\n      }\n    ]\n  }\n]"
               ,"");
    common_chat_msg::common_chat_msg((common_chat_msg *)&local_788,&message_user_parts);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_788;
    std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::vector
              ((vector<common_chat_msg,_std::allocator<common_chat_msg>_> *)local_988,__l_00,
               (allocator_type *)&local_910);
    common_chat_msgs_to_json_oaicompat<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              ((vector<common_chat_msg,_std::allocator<common_chat_msg>_> *)&local_940,
               SUB81(local_988,0));
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::dump((string_t *)local_818,
           (basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            *)&local_940,2,' ',false,strict);
    assert_equals<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_8f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_818);
    if ((pointer)local_818._0_8_ != (pointer)local_808) {
      operator_delete((void *)local_818._0_8_,(ulong)(local_808._0_8_ + 1));
    }
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data((data *)&local_940);
    std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::~vector
              ((vector<common_chat_msg,_std::allocator<common_chat_msg>_> *)local_988);
    common_chat_msg::~common_chat_msg((common_chat_msg *)&local_788);
    if ((pointer *)local_8f8._M_unused._0_8_ != &local_8e8) {
      operator_delete(local_8f8._M_unused._M_object,
                      (ulong)((long)&(local_8e8->name)._M_dataplus._M_p + 1));
    }
    local_8f8._M_unused._M_object = &local_8e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_8f8,
               "[\n  {\n    \"role\": \"assistant\",\n    \"content\": null,\n    \"tool_calls\": [\n      {\n        \"type\": \"function\",\n        \"function\": {\n          \"name\": \"python\",\n          \"arguments\": \"{\\\"code\\\": \\\"print(\'hey\')\\\"}\"\n        }\n      }\n    ]\n  }\n]"
               ,"");
    common_chat_msg::common_chat_msg((common_chat_msg *)&local_788,&message_assist_call_python);
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)&local_788;
    std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::vector
              ((vector<common_chat_msg,_std::allocator<common_chat_msg>_> *)local_988,__l_01,
               (allocator_type *)&local_910);
    common_chat_msgs_to_json_oaicompat<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              ((vector<common_chat_msg,_std::allocator<common_chat_msg>_> *)&local_940,
               SUB81(local_988,0));
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::dump((string_t *)local_818,
           (basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            *)&local_940,2,' ',false,strict);
    assert_equals<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_8f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_818);
    if ((pointer)local_818._0_8_ != (pointer)local_808) {
      operator_delete((void *)local_818._0_8_,(ulong)(local_808._0_8_ + 1));
    }
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data((data *)&local_940);
    std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::~vector
              ((vector<common_chat_msg,_std::allocator<common_chat_msg>_> *)local_988);
    common_chat_msg::~common_chat_msg((common_chat_msg *)&local_788);
    if ((pointer *)local_8f8._M_unused._0_8_ != &local_8e8) {
      operator_delete(local_8f8._M_unused._M_object,
                      (ulong)((long)&(local_8e8->name)._M_dataplus._M_p + 1));
    }
    local_788._M_allocated_capacity = 0;
    local_788._8_8_ = 0;
    local_778._M_allocated_capacity = 0;
    local_778._8_8_ = 0;
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::parse<char_const(&)[42]>
              ((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)local_8f8._M_pod_data,
               (char (*) [42])"[{\"role\": \"assistant\", \"tool_calls\": []}]",
               (parser_callback_t *)&local_788,true,false);
    common_chat_msgs_parse_oaicompat<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              ((vector<common_chat_msg,_std::allocator<common_chat_msg>_> *)local_988,
               (json *)&local_8f8);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data((data *)&local_8f8);
    if ((code *)local_778._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_778._M_allocated_capacity)(&local_788,&local_788,3);
    }
    local_8f8._M_unused._M_member_pointer = 1;
    local_818._0_8_ = ((long)(local_988._8_8_ - local_988._0_8_) >> 4) * 0x4ec4ec4ec4ec4ec5;
    assert_equals<unsigned_long>((unsigned_long *)local_8f8._M_pod_data,(unsigned_long *)local_818);
    local_8e8 = (pointer)0x6e61747369737361;
    _Stack_8e0._M_p._0_2_ = 0x74;
    local_8f8._8_8_ = 9;
    local_8f8._M_unused._M_object = &local_8e8;
    assert_equals<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_988._0_8_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_8f8);
    if ((pointer *)local_8f8._M_unused._0_8_ != &local_8e8) {
      operator_delete(local_8f8._M_unused._M_object,
                      (ulong)((long)&(local_8e8->name)._M_dataplus._M_p + 1));
    }
    local_8f8._M_pod_data[0] = '\x01';
    local_818[0] = (vector<common_chat_msg,std::allocator<common_chat_msg>>)
                   (((string *)(local_988._0_8_ + 0x20))->_M_string_length == 0);
    assert_equals<bool>((bool *)local_8f8._M_pod_data,(bool *)local_818);
    local_8f8._M_pod_data[0] = 1;
    local_818[0] = (vector<common_chat_msg,std::allocator<common_chat_msg>>)
                   ((((vector<common_chat_tool_call,_std::allocator<common_chat_tool_call>_> *)
                     (local_988._0_8_ + 0x58))->
                    super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>
                    )._M_impl.super__Vector_impl_data._M_start ==
                   (((vector<common_chat_tool_call,_std::allocator<common_chat_tool_call>_> *)
                    (local_988._0_8_ + 0x58))->
                   super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>
                   )._M_impl.super__Vector_impl_data._M_finish);
    assert_equals<bool>((bool *)local_8f8._M_pod_data,(bool *)local_818);
    local_8f8._M_unused._M_object = (void *)0x0;
    local_8f8._8_8_ = 0;
    local_8e8 = (pointer)0x0;
    _Stack_8e0._M_p = (pointer)0x0;
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::parse<char_const(&)[24]>
              ((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)local_818,(char (*) [24])"[{\"role\": \"assistant\"}]",
               (parser_callback_t *)&local_8f8,true,false);
    common_chat_msgs_parse_oaicompat<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              ((vector<common_chat_msg,_std::allocator<common_chat_msg>_> *)&local_940,
               (json *)local_818);
    std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::~vector
              ((vector<common_chat_msg,_std::allocator<common_chat_msg>_> *)&local_940);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data((data *)local_818);
    if (local_8e8 != (pointer)0x0) {
      (*(code *)local_8e8)(&local_8f8,&local_8f8,3);
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Expected exception");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_808._8_8_ = local_808 + 0x18;
  local_818._0_8_ = (pointer)0x0;
  local_818._8_8_ = (pointer)0x0;
  local_808._0_8_ = (pointer)0x0;
  local_808._16_8_ = 0;
  local_808[0x18] = '\0';
  local_808._40_8_ = local_808 + 0x38;
  local_808._48_8_ = 0;
  local_808[0x38] = '\0';
  local_808[0x48] = true;
  local_808[0x49] = true;
  local_7b8._0_8_ = (pointer)0x0;
  local_7b8._8_5_ = 0;
  local_7b8._13_3_ = 0;
  local_7b8._16_5_ = 0;
  local_7b8._21_8_ = 0;
  local_79b = true;
  local_788._M_allocated_capacity = (size_type)&local_778;
  local_788._8_8_ = 0;
  local_778._M_allocated_capacity = local_778._M_allocated_capacity & 0xffffffffffffff00;
  local_768._M_allocated_capacity = (size_type)&local_758;
  local_768._8_8_ = (char *)0x0;
  local_758._M_local_buf[0] = '\0';
  local_718 = &local_708;
  local_748._M_allocated_capacity = 0;
  local_748._8_8_ = 0;
  local_738 = 0;
  uStack_730 = 0;
  local_728 = 0;
  uStack_720 = 0;
  local_710 = 0;
  local_708._M_local_buf[0] = '\0';
  local_6f8 = &local_6e8;
  local_6f0 = 0;
  local_6e8._M_local_buf[0] = '\0';
  local_6d8 = &local_6c8;
  local_6d0 = 0;
  local_6c8._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_replace((ulong)&local_788,0,(char *)0x0,0x1c8d85);
  std::__cxx11::string::_M_replace((ulong)&local_768,0,(char *)local_768._8_8_,0x1c8d95);
  common_chat_msg::common_chat_msg((common_chat_msg *)&local_8f8,(common_chat_msg *)&local_788);
  std::vector<common_chat_msg,std::allocator<common_chat_msg>>::
  _M_assign_aux<common_chat_msg_const*>
            ((vector<common_chat_msg,std::allocator<common_chat_msg>> *)local_818,&local_8f8,
             local_828);
  common_chat_msg::~common_chat_msg((common_chat_msg *)&local_8f8);
  local_8f8._M_unused._M_object = &local_8e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_8f8,special_function_tool.name._M_dataplus._M_p,
             special_function_tool.name._M_dataplus._M_p +
             special_function_tool.name._M_string_length);
  local_8d8 = local_8d0._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_8d8,special_function_tool.description._M_dataplus._M_p,
             special_function_tool.description._M_dataplus._M_p +
             special_function_tool.description._M_string_length);
  local_8b8[0] = &local_8a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_8b8,special_function_tool.parameters._M_dataplus._M_p,
             special_function_tool.parameters._M_dataplus._M_p +
             special_function_tool.parameters._M_string_length);
  std::vector<common_chat_tool,std::allocator<common_chat_tool>>::
  _M_assign_aux<common_chat_tool_const*>
            ((vector<common_chat_tool,std::allocator<common_chat_tool>> *)local_7b8,&local_8f8,
             &local_8a8.
              super__Vector_base<common_grammar_trigger,_std::allocator<common_grammar_trigger>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (local_8b8[0] != &local_8a8) {
    operator_delete(local_8b8[0],
                    (ulong)((long)&(local_8a8.
                                    super__Vector_base<common_grammar_trigger,_std::allocator<common_grammar_trigger>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->type + 1));
  }
  if (local_8d8 != local_8d0._M_local_buf + 8) {
    operator_delete(local_8d8,local_8d0._8_8_ + 1);
  }
  if ((pointer *)local_8f8._M_unused._0_8_ != &local_8e8) {
    operator_delete(local_8f8._M_unused._M_object,
                    (ulong)((long)&(local_8e8->name)._M_dataplus._M_p + 1));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"| Template | Format |\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"|----------|--------|\n",0x16);
  uVar5 = 2;
  if (2 < argc) {
    uVar5 = (ulong)(uint)argc;
  }
  uVar6 = 1;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_960,argv[uVar6],(allocator<char> *)local_8f8._M_pod_data);
    puVar2 = (undefined1 *)
             std::__cxx11::string::rfind((char *)local_960,0x1cae11,0xffffffffffffffff);
    if (puVar2 == (undefined1 *)
                  ((long)&(((common_chat_msg *)(local_960._8_8_ + -0xd0))->tool_call_id).field_2 +
                  10)) {
      read_templates((string *)&local_920);
      local_8f8._M_unused._M_object = &local_8e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_8f8,"/","");
      string_split(&local_910,(string *)local_960,(string *)&local_8f8);
      if ((pointer *)local_8f8._M_unused._0_8_ != &local_8e8) {
        operator_delete(local_8f8._M_unused._M_object,
                        (ulong)((long)&(local_8e8->name)._M_dataplus._M_p + 1));
      }
      local_988._0_8_ = local_988 + 0x10;
      pcVar1 = local_910.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_988,pcVar1,
                 pcVar1 + local_910.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length);
      common_chat_templates_apply
                ((common_chat_params *)&local_8f8,
                 (common_chat_templates *)local_920._M_allocated_capacity,
                 (common_chat_templates_inputs *)local_818);
      common_chat_format_name_abi_cxx11_((string *)&local_940,local_8f8._0_4_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(local_878);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_890);
      std::vector<common_grammar_trigger,_std::allocator<common_grammar_trigger>_>::~vector
                (&local_8a8);
      if ((_Alloc_hider *)local_8d0._M_allocated_capacity != &local_8c0) {
        operator_delete((void *)local_8d0._M_allocated_capacity,(ulong)(local_8c0._M_p + 1));
      }
      if ((_Alloc_hider *)local_8f8._8_8_ != &_Stack_8e0) {
        operator_delete((void *)local_8f8._8_8_,(ulong)(_Stack_8e0._M_p + 1));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"| ",2);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_988._0_8_,local_988._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," | ",3);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(char *)local_940._M_allocated_capacity,local_940._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," |\n",3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_940._M_allocated_capacity != &local_930) {
        operator_delete((void *)local_940._M_allocated_capacity,local_930._M_allocated_capacity + 1)
        ;
      }
      if ((pointer)local_988._0_8_ != (pointer)(local_988 + 0x10)) {
        operator_delete((void *)local_988._0_8_,
                        (ulong)((long)&(((string *)local_988._16_8_)->_M_dataplus)._M_p + 1));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_910);
      std::unique_ptr<common_chat_templates,_common_chat_templates_deleter>::~unique_ptr
                ((unique_ptr<common_chat_templates,_common_chat_templates_deleter> *)
                 &local_920._M_allocated_capacity);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Skipping non-jinja file: ",0x19);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_960._0_8_,local_960._8_8_);
      local_828[0] = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_828,1);
    }
    if ((common_chat_msg *)local_960._0_8_ != (common_chat_msg *)(local_960 + 0x10)) {
      operator_delete((void *)local_960._0_8_,local_960._16_8_ + 1);
    }
    uVar6 = uVar6 + 1;
  } while (uVar5 != uVar6);
  common_chat_msg::~common_chat_msg((common_chat_msg *)&local_788);
  std::vector<common_chat_tool,_std::allocator<common_chat_tool>_>::~vector
            ((vector<common_chat_tool,_std::allocator<common_chat_tool>_> *)local_7b8);
  if ((undefined1 *)local_808._40_8_ != local_808 + 0x38) {
    operator_delete((void *)local_808._40_8_,CONCAT71(local_808._57_7_,local_808[0x38]) + 1);
  }
  if ((undefined1 *)local_808._8_8_ != local_808 + 0x18) {
    operator_delete((void *)local_808._8_8_,CONCAT71(local_808._25_7_,local_808[0x18]) + 1);
  }
  std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::~vector
            ((vector<common_chat_msg,_std::allocator<common_chat_msg>_> *)local_818);
  return 0;
}

Assistant:

int main(int argc, char ** argv) {
    // try {
#ifndef _WIN32
        if (argc > 1) {
            common_chat_templates_inputs inputs;
            common_chat_msg msg;
            msg.role = "user";
            msg.content = "Hey";
            inputs.messages = {msg};
            inputs.tools = { special_function_tool };

            std::cout << "| Template | Format |\n";
            std::cout << "|----------|--------|\n";

            for (int i = 1; i < argc; i++) {
                try {
                    std::string path = argv[i];
                    if (path.rfind(".jinja") != path.size() - 6) {
                        std::cerr << "Skipping non-jinja file: " << path << '\n';
                        continue;
                    }
                    auto tmpls = read_templates(path);
                    auto parts  = string_split(path, "/");
                    auto name   = parts[parts.size() - 1];
                    auto format = common_chat_format_name(common_chat_templates_apply(tmpls.get(), inputs).format);
                    std::cout << "| " << name << " | " << format << " |\n";
                } catch (const std::exception & e) {
                    std::cerr << "Failed to process " << argv[i] << ": " << e.what() << '\n';
                }
            }
        } else
#endif
        {
            test_msgs_oaicompat_json_conversion();
            test_tools_oaicompat_json_conversion();
            test_template_output_parsers();
            std::cout << "\n[chat] All tests passed!" << '\n';
        }
        return 0;
    // } catch (const std::exception & e) {
    //     std::cerr << "Error: " << e.what() << '\n';
    //     return 1;
    // }
}